

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

ssize_t archive_acl_text_len
                  (archive_acl *acl,wchar_t want_type,wchar_t flags,wchar_t wide,archive *a,
                  archive_string_conv *sc)

{
  int iVar1;
  wchar_t wVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  size_t local_70;
  size_t len;
  ssize_t length;
  wchar_t r;
  wchar_t tmp;
  wchar_t idlen;
  wchar_t count;
  wchar_t *wname;
  char *name;
  archive_acl_entry *ap;
  archive_string_conv *sc_local;
  archive *a_local;
  wchar_t local_20;
  wchar_t wide_local;
  wchar_t flags_local;
  wchar_t want_type_local;
  archive_acl *acl_local;
  
  tmp = L'\0';
  len = 0;
  name = (char *)acl->acl_head;
  ap = (archive_acl_entry *)sc;
  sc_local = (archive_string_conv *)a;
  a_local._4_4_ = wide;
  local_20 = flags;
  wide_local = want_type;
  _flags_local = acl;
  do {
    if (name == (char *)0x0) {
      if ((wide_local & 0x100U) == 0) {
        if (tmp == L'\0') {
          return 0;
        }
      }
      else if ((local_20 & 4U) == 0) {
        len = len + 0x20;
      }
      else {
        len = len + 0x1f;
      }
      return len;
    }
    if (((*(uint *)(name + 8) & wide_local) != 0) &&
       ((*(int *)(name + 8) != 0x100 ||
        (((*(int *)(name + 0xc) != 0x2712 && (*(int *)(name + 0xc) != 0x2714)) &&
         (*(int *)(name + 0xc) != 0x2716)))))) {
      tmp = tmp + L'\x01';
      if (((wide_local & 0x200U) != 0) && ((*(uint *)(name + 8) & 0x200) != 0)) {
        len = len + 8;
      }
      iVar1 = *(int *)(name + 0xc);
      if (iVar1 == 0x2711) {
LAB_0060e647:
        len = len + 4;
      }
      else {
        if (iVar1 == 0x2712) {
          if (wide_local == L'㰀') {
            len = len + 6;
            goto LAB_0060e688;
          }
          goto LAB_0060e647;
        }
        if (iVar1 == 0x2713) {
LAB_0060e66e:
          len = len + 5;
        }
        else if (iVar1 == 0x2714) {
          if (wide_local != L'㰀') goto LAB_0060e66e;
          len = len + 6;
        }
        else {
          if (iVar1 == 0x2715) goto LAB_0060e647;
          if (iVar1 == 0x2716) goto LAB_0060e66e;
          if (iVar1 == 0x277b) {
            len = len + 9;
          }
        }
      }
LAB_0060e688:
      sVar3 = len + 1;
      if ((*(int *)(name + 0xc) == 0x2711) || (*(int *)(name + 0xc) == 0x2713)) {
        len = sVar3;
        if (a_local._4_4_ == L'\0') {
          wVar2 = archive_mstring_get_mbs_l
                            ((archive_mstring *)(name + 0x18),(char **)&wname,&local_70,
                             (archive_string_conv *)ap);
          if (wVar2 != L'\0') {
            return 0;
          }
          if ((local_70 == 0) || (wname == (wchar_t *)0x0)) {
            len = len + 0xd;
          }
          else {
            len = local_70 + len;
          }
          length._0_4_ = L'\0';
        }
        else {
          length._0_4_ = archive_mstring_get_wcs
                                   ((archive *)sc_local,(archive_mstring *)(name + 0x18),
                                    (wchar_t **)&idlen);
          if (((wchar_t)length == L'\0') && (_idlen != (wchar_t *)0x0)) {
            sVar4 = wcslen(_idlen);
            len = sVar4 + len;
          }
          else {
            if (((wchar_t)length < L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) {
              return 0;
            }
            len = len + 0xd;
          }
        }
        sVar3 = len + 1;
      }
      else if (wide_local != L'㰀') {
        sVar3 = len + 2;
      }
      len = sVar3;
      if ((((local_20 & 4U) != 0) && ((wide_local & 0x300U) != 0)) &&
         ((*(int *)(name + 0xc) == 0x2716 || (*(int *)(name + 0xc) == 0x2715)))) {
        len = len - 1;
      }
      if (wide_local == L'㰀') {
        sVar3 = len + 0x1b;
        if ((*(uint *)(name + 8) & 0x800) == 0) {
          sVar3 = len + 0x1c;
        }
      }
      else {
        sVar3 = len + 3;
      }
      len = sVar3;
      if (((*(int *)(name + 0xc) == 0x2711) || (*(int *)(name + 0xc) == 0x2713)) &&
         ((local_20 & 1U) != 0)) {
        r = L'\x01';
        for (length._4_4_ = *(int *)(name + 0x14); 9 < length._4_4_;
            length._4_4_ = length._4_4_ / 10) {
          r = r + L'\x01';
        }
        len = (long)r + len + 1;
      }
      len = len + 1;
    }
    name = *(char **)name;
  } while( true );
}

Assistant:

static ssize_t
archive_acl_text_len(struct archive_acl *acl, int want_type, int flags,
    int wide, struct archive *a, struct archive_string_conv *sc) {
	struct archive_acl_entry *ap;
	const char *name;
	const wchar_t *wname;
	int count, idlen, tmp, r;
	ssize_t length;
	size_t len;

	count = 0;
	length = 0;
	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		count++;
		if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0
		    && (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
			length += 8; /* "default:" */
		switch (ap->tag) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "owner@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_USER:
		case ARCHIVE_ENTRY_ACL_MASK:
			length += 4; /* "user", "mask" */
			break;
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
				length += 6; /* "group@" */
				break;
			}
			/* FALLTHROUGH */
		case ARCHIVE_ENTRY_ACL_GROUP:
		case ARCHIVE_ENTRY_ACL_OTHER:
			length += 5; /* "group", "other" */
			break;
		case ARCHIVE_ENTRY_ACL_EVERYONE:
			length += 9; /* "everyone@" */
			break;
		}
		length += 1; /* colon after tag */
		if (ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) {
			if (wide) {
				r = archive_mstring_get_wcs(a, &ap->name,
				    &wname);
				if (r == 0 && wname != NULL)
					length += wcslen(wname);
				else if (r < 0 && errno == ENOMEM)
					return (0);
				else
					length += sizeof(uid_t) * 3 + 1;
			} else {
				r = archive_mstring_get_mbs_l(&ap->name, &name,
				    &len, sc);
				if (r != 0)
					return (0);
				if (len > 0 && name != NULL)
					length += len;
				else
					length += sizeof(uid_t) * 3 + 1;
			}
			length += 1; /* colon after user or group name */
		} else if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4)
			length += 1; /* 2nd colon empty user,group or other */

		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0)
		    && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_OTHER
		    || ap->tag == ARCHIVE_ENTRY_ACL_MASK)) {
			/* Solaris has no colon after other: and mask: */
			length = length - 1;
		}

		if (want_type == ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* rwxpdDaARWcCos:fdinSFI:deny */
			length += 27;
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DENY) == 0)
				length += 1; /* allow, alarm, audit */
		} else
			length += 3; /* rwx */

		if ((ap->tag == ARCHIVE_ENTRY_ACL_USER ||
		    ap->tag == ARCHIVE_ENTRY_ACL_GROUP) &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID) != 0) {
			length += 1; /* colon */
			/* ID digit count */
			idlen = 1;
			tmp = ap->id;
			while (tmp > 9) {
				tmp = tmp / 10;
				idlen++;
			}
			length += idlen;
		}
		length ++; /* entry separator */
	}

	/* Add filemode-mapping access entries to the length */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		if ((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) != 0) {
			/* "user::rwx\ngroup::rwx\nother:rwx\n" */
			length += 31;
		} else {
			/* "user::rwx\ngroup::rwx\nother::rwx\n" */
			length += 32;
		}
	} else if (count == 0)
		return (0);

	/* The terminating character is included in count */
	return (length);
}